

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

SyncInfo __thiscall
vkt::synchronization::anon_unknown_0::CopyBuffer::Implementation::getSyncInfo(Implementation *this)

{
  SyncInfo SVar1;
  
  SVar1._0_8_ = ((ulong)(this->m_mode != ACCESS_MODE_READ) << 0x2b) + 0x80000001000;
  SVar1.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  return SVar1;
}

Assistant:

SyncInfo getSyncInfo (void) const
	{
		const VkAccessFlags access		= (m_mode == ACCESS_MODE_READ ? VK_ACCESS_TRANSFER_READ_BIT : VK_ACCESS_TRANSFER_WRITE_BIT);
		const SyncInfo		syncInfo	=
		{
			VK_PIPELINE_STAGE_TRANSFER_BIT,		// VkPipelineStageFlags		stageMask;
			access,								// VkAccessFlags			accessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,			// VkImageLayout			imageLayout;
		};
		return syncInfo;
	}